

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

WasmString * __thiscall
w3Module::read_string(WasmString *__return_storage_ptr__,w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  w3BuiltinString wVar2;
  ulong uVar3;
  string local_48;
  
  uVar1 = ::read_varuint32(cursor,this->end);
  uVar3 = (ulong)uVar1;
  if (this->end < *cursor + uVar3) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"malformed in read_string","");
    ThrowString(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  __return_storage_ptr__->data = (PCH)0x0;
  __return_storage_ptr__->size = 0;
  (__return_storage_ptr__->storage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->storage).field_2;
  (__return_storage_ptr__->storage)._M_string_length = 0;
  (__return_storage_ptr__->storage).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->builtin = w3BuiltinString_none;
  __return_storage_ptr__->builtinStorage = false;
  __return_storage_ptr__->data = (PCH)*cursor;
  __return_storage_ptr__->size = uVar3;
  if (-1 < (int)uVar1) {
    printf("read_string %X:%.*s\n",uVar3,uVar3);
  }
  if (uVar3 == 5) {
    if ((char)*(int *)((long)*cursor + 4) != 'n' || *(int *)*cursor != 0x69616d5f)
    goto LAB_0010f3d9;
    wVar2 = w3BuiltinString_main;
  }
  else {
    if ((uVar1 != 7) || (*(int *)((long)*cursor + 3) != 0x74726174 || *(int *)*cursor != 0x74735f24)
       ) goto LAB_0010f3d9;
    wVar2 = w3BuiltinString_start;
  }
  __return_storage_ptr__->builtin = wVar2;
LAB_0010f3d9:
  *cursor = *cursor + uVar3;
  return __return_storage_ptr__;
}

Assistant:

WasmString w3Module::read_string (uint8_t** cursor)
{
    const uint32_t size = read_varuint32 (cursor);
    if (size + *cursor > end)
        ThrowString ("malformed in read_string");
    // TODO UTF8 handling
    WasmString a;
    a.data = (PCH)*cursor;
    a.size = size;

    // TODO string recognizer?
    if (size <= INT_MAX)
        printf ("read_string %X:%.*s\n", size, (int)size, *cursor);
    if (size == 7 && !memcmp (*cursor, "$_start", 7))
    {
        a.builtin = w3BuiltinString_start;
    }
    else if (size == 5 && !memcmp (*cursor, "_main", 5))
    {
        a.builtin = w3BuiltinString_main;
    }
    *cursor += size;
    return a;
}